

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_ref_t * flatcc_builder_table_add_offset(flatcc_builder_t *B,int id)

{
  ulong uVar1;
  flatbuffers_voffset_t *pfVar2;
  int iVar3;
  uint uVar4;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x738,
                  "flatcc_builder_ref_t *flatcc_builder_table_add_offset(flatcc_builder_t *, int)");
  }
  if (0x7ffc < (uint)id) {
    __assert_fail("id >= 0 && id <= (int)((65535) / sizeof(flatbuffers_voffset_t) - 3)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x739,
                  "flatcc_builder_ref_t *flatcc_builder_table_add_offset(flatcc_builder_t *, int)");
  }
  if (B->vs[(uint)id] != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x740,
                  "flatcc_builder_ref_t *flatcc_builder_table_add_offset(flatcc_builder_t *, int)");
  }
  B->vt_hash = ((B->vt_hash ^ id) * -0x61c8864f ^ 4) * -0x61c8864f;
  uVar4 = B->ds_offset + 3 & 0xfffffffc;
  uVar1 = (ulong)uVar4 + 4;
  B->ds_offset = (uint)uVar1;
  if ((B->ds_limit < (uint)uVar1) && (iVar3 = reserve_ds(B,uVar1 & 0xffffffff,0xfffc), iVar3 != 0))
  {
    return (flatcc_builder_ref_t *)0x0;
  }
  B->vs[(uint)id] = (flatbuffers_voffset_t)uVar1;
  if (B->id_end <= (ushort)id) {
    B->id_end = (ushort)id + 1;
  }
  pfVar2 = B->pl;
  B->pl = pfVar2 + 1;
  *pfVar2 = (flatbuffers_voffset_t)uVar4;
  return (flatcc_builder_ref_t *)(B->ds + uVar4);
}

Assistant:

flatcc_builder_ref_t *flatcc_builder_table_add_offset(flatcc_builder_t *B, int id)
{
    check(frame(type) == flatcc_builder_table, "expected table frame");
    check(id >= 0 && id <= (int)FLATBUFFERS_ID_MAX, "table id out of range");
#if FLATCC_BUILDER_ALLOW_REPEAT_TABLE_ADD
    if (B->vs[id] != 0) {
        return B->ds + B->vs[id] - field_size;
    }
#else
    if (B->vs[id] != 0) {
        check(0, "table field already set");
        return 0;
    }
#endif
    FLATCC_BUILDER_UPDATE_VT_HASH(B->vt_hash, (uint32_t)id, (uint32_t)field_size);
    return push_ds_offset_field(B, (voffset_t)id);
}